

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpdf-c.cc
# Opt level: O2

qpdf_oh qpdf_oh_new_binary_unicode_string(qpdf_data qpdf,char *utf8_str,size_t length)

{
  qpdf_oh qVar1;
  QPDFObjectHandle local_40;
  string local_30;
  
  local_30._M_dataplus._M_p = (pointer)&local_30.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_30,utf8_str,utf8_str + length);
  QPDFObjectHandle::newUnicodeString(&local_40,&local_30);
  qVar1 = new_object(qpdf,&local_40);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_40.super_BaseHandle.obj.
              super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::__cxx11::string::~string((string *)&local_30);
  return qVar1;
}

Assistant:

qpdf_oh
qpdf_oh_new_binary_unicode_string(qpdf_data qpdf, char const* utf8_str, size_t length)
{
    QTC::TC("qpdf", "qpdf-c called qpdf_oh_new_binary_unicode_string");
    return new_object(qpdf, QPDFObjectHandle::newUnicodeString(std::string(utf8_str, length)));
}